

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_util.cc
# Opt level: O2

void __thiscall
google::protobuf::util::anon_unknown_0::StatusErrorListener::InvalidValue
          (StatusErrorListener *this,LocationTrackerInterface *loc,StringPiece type_name,
          StringPiece value)

{
  stringpiece_ssize_type sVar1;
  StringPiece error_message;
  pointer local_1a8;
  size_type sStack_1a0;
  AlphaNum local_178;
  undefined1 local_148 [8];
  StringPiece value_local;
  AlphaNum local_108;
  string local_d8;
  undefined1 local_b8 [40];
  string local_90;
  string local_70;
  string local_50;
  undefined1 local_30 [8];
  StringPiece type_name_local;
  
  value_local.ptr_ = (char *)value.length_;
  local_148 = (undefined1  [8])value.ptr_;
  type_name_local.ptr_ = (char *)type_name.length_;
  local_30 = (undefined1  [8])type_name.ptr_;
  (anonymous_namespace)::StatusErrorListener::GetLocString_abi_cxx11_
            (&local_d8,loc,(LocationTrackerInterface *)local_30);
  local_1a8 = local_d8._M_dataplus._M_p;
  sStack_1a0 = local_d8._M_string_length;
  value_local.length_ = (stringpiece_ssize_type)anon_var_dwarf_4b80ff;
  StringPiece::ToString_abi_cxx11_(&local_90,(StringPiece *)local_148);
  local_178.piece_data_ = local_90._M_dataplus._M_p;
  local_178.piece_size_ = local_90._M_string_length;
  local_108.piece_data_ = " for type ";
  local_108.piece_size_ = 10;
  StringPiece::ToString_abi_cxx11_(&local_70,(StringPiece *)local_30);
  StrCat_abi_cxx11_(&local_50,(protobuf *)&local_1a8,(AlphaNum *)&value_local.length_,&local_178,
                    &local_108,(AlphaNum *)&stack0xfffffffffffffe28,
                    (AlphaNum *)local_70._M_dataplus._M_p);
  sVar1 = StringPiece::CheckedSsizeTFromSizeT(local_50._M_string_length);
  error_message.length_ = sVar1;
  error_message.ptr_ = local_50._M_dataplus._M_p;
  Status::Status((Status *)local_b8,INVALID_ARGUMENT,error_message);
  Status::operator=(&this->status_,(Status *)local_b8);
  std::__cxx11::string::~string((string *)(local_b8 + 8));
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_d8);
  return;
}

Assistant:

void InvalidValue(const converter::LocationTrackerInterface& loc,
                    StringPiece type_name,
                    StringPiece value) override {
    status_ = util::Status(
        util::error::INVALID_ARGUMENT,
        StrCat(GetLocString(loc), ": invalid value ", string(value),
                     " for type ", string(type_name)));
  }